

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::PixelGameEngine::olc_CoreUpdate(PixelGameEngine *this)

{
  bool bVar1;
  uint uVar2;
  pointer pPVar3;
  reference ppPVar4;
  pointer pRVar5;
  reference pvVar6;
  pointer pLVar7;
  pointer pLVar8;
  pointer pLVar9;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string sTitle;
  DecalInstance *decal;
  iterator __end4;
  iterator __begin4;
  vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_> *__range4;
  undefined1 local_88 [16];
  reverse_iterator layer;
  PGEX **ext_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_> *__range1_1;
  PGEX **ext;
  iterator __end1;
  iterator __begin1;
  vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_> *__range1;
  anon_class_1_0_00000001 ScanHardware;
  type tStack_28;
  float fElapsedTime;
  duration<float,_std::ratio<1L,_1L>_> local_1c;
  rep rStack_18;
  duration<float,_std::ratio<1L,_1L>_> elapsedTime;
  PixelGameEngine *this_local;
  
  rStack_18 = std::chrono::_V2::system_clock::now();
  (this->m_tp2).__d.__r = rStack_18;
  tStack_28 = std::chrono::operator-(&this->m_tp2,&this->m_tp1);
  std::chrono::duration<float,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<float,std::ratio<1l,1l>> *)&local_1c,&stack0xffffffffffffffd8);
  (this->m_tp1).__d.__r = (this->m_tp2).__d.__r;
  __range1._4_4_ = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&local_1c);
  this->fLastElapsed = __range1._4_4_;
  pPVar3 = std::unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_>::operator->
                     ((unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_> *)&platform);
  (*pPVar3->_vptr_Platform[10])();
  olc_CoreUpdate::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&__range1 + 3),this->pKeyboardState,
             this->pKeyOldState,this->pKeyNewState,0x100);
  olc_CoreUpdate::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&__range1 + 3),this->pMouseState,this->pMouseOldState
             ,this->pMouseNewState,5);
  this->vMousePos = this->vMousePosCache;
  this->nMouseWheelDelta = this->nMouseWheelDeltaCache;
  this->nMouseWheelDeltaCache = 0;
  __end1 = std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::begin(&this->vExtensions);
  ext = (PGEX **)std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::end(&this->vExtensions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_>
                                     *)&ext), bVar1) {
    ppPVar4 = __gnu_cxx::
              __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_>
              ::operator*(&__end1);
    (*(*ppPVar4)->_vptr_PGEX[2])(*ppPVar4,(long)&__range1 + 4);
    __gnu_cxx::
    __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_>::
    operator++(&__end1);
  }
  uVar2 = (*this->_vptr_PixelGameEngine[3])(__range1._4_4_);
  if ((uVar2 & 1) == 0) {
    std::atomic<bool>::operator=((atomic<bool> *)&bAtomActive,false);
  }
  __end1_1 = std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::begin(&this->vExtensions);
  ext_1 = (PGEX **)std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::end(&this->vExtensions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_>
                             *)&ext_1), bVar1) {
    ppPVar4 = __gnu_cxx::
              __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_>
              ::operator*(&__end1_1);
    (*(*ppPVar4)->_vptr_PGEX[3])(__range1._4_4_);
    __gnu_cxx::
    __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_>::
    operator++(&__end1_1);
  }
  pRVar5 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                     ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)&renderer);
  (*pRVar5->_vptr_Renderer[0xf])(pRVar5,&this->vViewPos,&this->vViewSize);
  pRVar5 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                     ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)&renderer);
  layer.current._M_current._4_4_ = BLACK;
  (*pRVar5->_vptr_Renderer[0x10])(pRVar5,(ulong)BLACK,1);
  pvVar6 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                     (&this->vLayers,0);
  pvVar6->bUpdate = true;
  pvVar6 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                     (&this->vLayers,0);
  pvVar6->bShow = true;
  layer.current._M_current._0_4_ = 0;
  SetDecalMode(this,(DecalMode *)&layer);
  pRVar5 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                     ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)&renderer);
  (*pRVar5->_vptr_Renderer[6])();
  std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::rbegin
            ((vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_> *)(local_88 + 8));
  while( true ) {
    std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::rend
              ((vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_> *)local_88);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                             *)(local_88 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                             *)local_88);
    if (!bVar1) break;
    pLVar7 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                           *)(local_88 + 8));
    if ((pLVar7->bShow & 1U) != 0) {
      pLVar7 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                             *)(local_88 + 8));
      bVar1 = std::operator==(&pLVar7->funcHook,(nullptr_t)0x0);
      if (bVar1) {
        pRVar5 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                           ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)
                            &renderer);
        pLVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                               *)(local_88 + 8));
        (*pRVar5->_vptr_Renderer[0xe])(pRVar5,(ulong)pLVar7->nResID);
        pLVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                               *)(local_88 + 8));
        if ((pLVar7->bUpdate & 1U) != 0) {
          pRVar5 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                             ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)
                              &renderer);
          pLVar7 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                                 *)(local_88 + 8));
          uVar2 = pLVar7->nResID;
          pLVar7 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                                 *)(local_88 + 8));
          (*pRVar5->_vptr_Renderer[0xb])(pRVar5,(ulong)uVar2,pLVar7->pDrawTarget);
          pLVar7 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                                 *)(local_88 + 8));
          pLVar7->bUpdate = false;
        }
        pRVar5 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                           ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)
                            &renderer);
        pLVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                               *)(local_88 + 8));
        pLVar8 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                               *)(local_88 + 8));
        pLVar9 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                               *)(local_88 + 8));
        (*pRVar5->_vptr_Renderer[8])(pRVar5,pLVar7,&pLVar8->vScale,(ulong)(pLVar9->tint).field_0.n);
        pLVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                               *)(local_88 + 8));
        __end4 = std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::begin
                           (&pLVar7->vecDecalInstance);
        decal = (DecalInstance *)
                std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::end
                          (&pLVar7->vecDecalInstance);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<olc::DecalInstance_*,_std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>_>
                                           *)&decal), bVar1) {
          sTitle.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<olc::DecalInstance_*,_std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>_>
               ::operator*(&__end4);
          pRVar5 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                             ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)
                              &renderer);
          (*pRVar5->_vptr_Renderer[9])(pRVar5,sTitle.field_2._8_8_);
          __gnu_cxx::
          __normal_iterator<olc::DecalInstance_*,_std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>_>
          ::operator++(&__end4);
        }
        pLVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                               *)(local_88 + 8));
        std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::clear
                  (&pLVar7->vecDecalInstance);
      }
      else {
        pLVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                               *)(local_88 + 8));
        std::function<void_()>::operator()(&pLVar7->funcHook);
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<olc::LayerDesc_*,_std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>_>_>
                  *)(local_88 + 8));
  }
  pRVar5 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                     ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)&renderer);
  (*pRVar5->_vptr_Renderer[5])();
  this->fFrameTimer = __range1._4_4_ + this->fFrameTimer;
  this->nFrameCount = this->nFrameCount + 1;
  if (1.0 <= this->fFrameTimer) {
    this->nLastFPS = this->nFrameCount;
    this->fFrameTimer = this->fFrameTimer + -1.0;
    std::operator+(&local_110,"OneLoneCoder.com - Pixel Game Engine - ",&this->sAppName);
    std::operator+(&local_f0,&local_110," - FPS: ");
    std::__cxx11::to_string(&local_140,this->nFrameCount);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    pPVar3 = std::unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_>::operator->
                       ((unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_> *)&platform)
    ;
    (*pPVar3->_vptr_Platform[8])(pPVar3,local_d0);
    this->nFrameCount = 0;
    std::__cxx11::string::~string((string *)local_d0);
  }
  return;
}

Assistant:

void PixelGameEngine::olc_CoreUpdate()
	{
		// Handle Timing
		m_tp2 = std::chrono::system_clock::now();
		std::chrono::duration<float> elapsedTime = m_tp2 - m_tp1;
		m_tp1 = m_tp2;

		// Our time per frame coefficient
		float fElapsedTime = elapsedTime.count();
		fLastElapsed = fElapsedTime;

		// Some platforms will need to check for events
		platform->HandleSystemEvent();

		// Compare hardware input states from previous frame
		auto ScanHardware = [&](HWButton *pKeys, bool *pStateOld, bool *pStateNew, uint32_t nKeyCount) {
			for (uint32_t i = 0; i < nKeyCount; i++)
			{
				pKeys[i].bPressed = false;
				pKeys[i].bReleased = false;
				if (pStateNew[i] != pStateOld[i])
				{
					if (pStateNew[i])
					{
						pKeys[i].bPressed = !pKeys[i].bHeld;
						pKeys[i].bHeld = true;
					}
					else
					{
						pKeys[i].bReleased = true;
						pKeys[i].bHeld = false;
					}
				}
				pStateOld[i] = pStateNew[i];
			}
		};

		ScanHardware(pKeyboardState, pKeyOldState, pKeyNewState, 256);
		ScanHardware(pMouseState, pMouseOldState, pMouseNewState, nMouseButtons);

		// Cache mouse coordinates so they remain consistent during frame
		vMousePos = vMousePosCache;
		nMouseWheelDelta = nMouseWheelDeltaCache;
		nMouseWheelDeltaCache = 0;

		//	renderer->ClearBuffer(olc::BLACK, true);

		// Handle Frame Update
		for (auto &ext : vExtensions)
			ext->OnBeforeUserUpdate(fElapsedTime);
		if (!OnUserUpdate(fElapsedTime))
			bAtomActive = false;
		for (auto &ext : vExtensions)
			ext->OnAfterUserUpdate(fElapsedTime);

		// Display Frame
		renderer->UpdateViewport(vViewPos, vViewSize);
		renderer->ClearBuffer(olc::BLACK, true);

		// Layer 0 must always exist
		vLayers[0].bUpdate = true;
		vLayers[0].bShow = true;
		SetDecalMode(DecalMode::NORMAL);
		renderer->PrepareDrawing();

		for (auto layer = vLayers.rbegin(); layer != vLayers.rend(); ++layer)
		{
			if (layer->bShow)
			{
				if (layer->funcHook == nullptr)
				{
					renderer->ApplyTexture(layer->nResID);
					if (layer->bUpdate)
					{
						renderer->UpdateTexture(layer->nResID, layer->pDrawTarget);
						layer->bUpdate = false;
					}

					renderer->DrawLayerQuad(layer->vOffset, layer->vScale, layer->tint);

					// Display Decals in order for this layer
					for (auto &decal : layer->vecDecalInstance)
						renderer->DrawDecal(decal);
					layer->vecDecalInstance.clear();
				}
				else
				{
					// Mwa ha ha.... Have Fun!!!
					layer->funcHook();
				}
			}
		}

		// Present Graphics to screen
		renderer->DisplayFrame();

		// Update Title Bar
		fFrameTimer += fElapsedTime;
		nFrameCount++;
		if (fFrameTimer >= 1.0f)
		{
			nLastFPS = nFrameCount;
			fFrameTimer -= 1.0f;
			std::string sTitle = "OneLoneCoder.com - Pixel Game Engine - " + sAppName + " - FPS: " + std::to_string(nFrameCount);
			platform->SetWindowTitle(sTitle);
			nFrameCount = 0;
		}
	}